

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspwm.cpp
# Opt level: O3

void __thiscall rw::BSPWM::swap(BSPWM *this,Window *a,Window *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  string *__str;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bspc","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"node","");
  uVar1 = a->window_id;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar6 = 1;
  if (9 < uVar2) {
    uVar5 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar6 = uVar3;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_00119861;
      }
      if (uVar4 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_00119861;
      }
      if (uVar4 < 10000) goto LAB_00119861;
      uVar5 = uVar5 / 10000;
      uVar3 = uVar6 + 4;
    } while (99999 < uVar4);
    uVar6 = uVar6 + 1;
  }
LAB_00119861:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar6 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0] + (uVar1 >> 0x1f),uVar6,uVar2);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"--swap","");
  uVar1 = b->window_id;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar6 = 1;
  if (9 < uVar2) {
    uVar5 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar6 = uVar3;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_00119922;
      }
      if (uVar4 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_00119922;
      }
      if (uVar4 < 10000) goto LAB_00119922;
      uVar5 = uVar5 / 10000;
      uVar3 = uVar6 + 4;
    } while (99999 < uVar4);
    uVar6 = uVar6 + 1;
  }
LAB_00119922:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar6 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar1 >> 0x1f),uVar6,uVar2);
  __l._M_len = 5;
  __l._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l,&local_e9);
  subprocess::call(&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  lVar7 = 0;
  do {
    if (local_40 + lVar7 != *(undefined1 **)((long)local_50 + lVar7)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar7));
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0xa0);
  return;
}

Assistant:

void BSPWM::swap(const Window *a, const Window *b) {
        subprocess::call({"bspc", "node", to_string(a->window_id),
                          "--swap", to_string(b->window_id)});
    }